

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_content_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_5b01dc::ScreenContentToolsTestLarge::ScreenContentToolsTestLarge
          (ScreenContentToolsTestLarge *this)

{
  __tuple_element_t<1UL,_tuple<const_CodecFactory_*,_TestMode,_aom_rc_mode>_> *p_Var1;
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_aom_rc_mode>_> *p_Var2;
  undefined8 *in_RDI;
  CodecFactory *in_stack_ffffffffffffffa8;
  EncoderTest *in_stack_ffffffffffffffb0;
  __tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_aom_rc_mode>_> *p_Var3;
  
  libaom_test::CodecTestWith2Params<libaom_test::TestMode,_aom_rc_mode>::CodecTestWith2Params
            ((CodecTestWith2Params<libaom_test::TestMode,_aom_rc_mode> *)in_stack_ffffffffffffffb0);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  ::GetParam();
  std::get<0ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_rc_mode>
            ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode> *)
             0x625b2c);
  libaom_test::EncoderTest::EncoderTest(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  *in_RDI = &PTR__ScreenContentToolsTestLarge_01f587e0;
  in_RDI[2] = &PTR__ScreenContentToolsTestLarge_01f58838;
  in_RDI[3] = &PTR__ScreenContentToolsTestLarge_01f58858;
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  ::GetParam();
  p_Var1 = std::get<1ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_rc_mode>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>
                       *)0x625b81);
  *(__tuple_element_t<1UL,_tuple<const_CodecFactory_*,_TestMode,_aom_rc_mode>_> *)
   ((long)in_RDI + 0x3f4) = *p_Var1;
  p_Var3 = (__tuple_element_t<2UL,_tuple<const_CodecFactory_*,_TestMode,_aom_rc_mode>_> *)
           (in_RDI + 0x80);
  testing::
  WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>_>
  ::GetParam();
  p_Var2 = std::get<2ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,aom_rc_mode>
                     ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_rc_mode>
                       *)0x625bb3);
  *p_Var3 = *p_Var2;
  *(undefined1 *)(in_RDI + 0x7f) = 1;
  *(undefined4 *)((long)in_RDI + 0x3fc) = 0;
  return;
}

Assistant:

ScreenContentToolsTestLarge()
      : EncoderTest(GET_PARAM(0)), encoding_mode_(GET_PARAM(1)),
        rc_end_usage_(GET_PARAM(2)) {
    is_screen_content_violated_ = true;
    tune_content_ = AOM_CONTENT_DEFAULT;
  }